

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int ecdh_calc_secret(ptls_iovec_t *out,EC_GROUP *group,EC_KEY *privkey,EC_POINT *peer_point)

{
  int iVar1;
  size_t __size;
  void *out_00;
  EC_POINT *in_RCX;
  EC_KEY *in_RDX;
  EC_GROUP *in_RSI;
  undefined8 *in_RDI;
  int ret;
  ptls_iovec_t secret;
  int local_34;
  
  iVar1 = EC_GROUP_get_degree(in_RSI);
  __size = (size_t)((iVar1 + 7) / 8);
  out_00 = malloc(__size);
  if (out_00 == (void *)0x0) {
    local_34 = 0x201;
  }
  else {
    iVar1 = ECDH_compute_key(out_00,__size,in_RCX,in_RDX,(KDF *)0x0);
    if (iVar1 < 1) {
      local_34 = 0x28;
    }
    else {
      local_34 = 0;
    }
  }
  if (local_34 == 0) {
    *in_RDI = out_00;
    in_RDI[1] = __size;
  }
  else {
    free(out_00);
    *in_RDI = 0;
    in_RDI[1] = 0;
  }
  return local_34;
}

Assistant:

static int ecdh_calc_secret(ptls_iovec_t *out, const EC_GROUP *group, EC_KEY *privkey, EC_POINT *peer_point)
{
    ptls_iovec_t secret;
    int ret;

    secret.len = (EC_GROUP_get_degree(group) + 7) / 8;
    if ((secret.base = malloc(secret.len)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    if (ECDH_compute_key(secret.base, secret.len, peer_point, privkey, NULL) <= 0) {
        ret = PTLS_ALERT_HANDSHAKE_FAILURE; /* ??? */
        goto Exit;
    }
    ret = 0;

Exit:
    if (ret == 0) {
        *out = secret;
    } else {
        free(secret.base);
        *out = (ptls_iovec_t){NULL};
    }
    return ret;
}